

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5StorageDocsize(Fts5Storage *p,i64 iRowid,int *aCol)

{
  uint uVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  sqlite3_stmt *pLookup;
  
  uVar1 = p->pConfig->nCol;
  pLookup = (sqlite3_stmt *)0x0;
  iVar2 = fts5StorageGetStmt(p,8,&pLookup,(char **)0x0);
  pStmt = pLookup;
  if (iVar2 == 0) {
    sqlite3_bind_int64(pLookup,1,iRowid);
    iVar2 = sqlite3_step(pStmt);
    bVar8 = true;
    if (iVar2 == 100) {
      uVar7 = 0;
      pvVar5 = sqlite3_column_blob(pStmt,0);
      iVar2 = sqlite3_column_bytes(pStmt,0);
      uVar6 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar6 = uVar7;
      }
      while( true ) {
        bVar8 = uVar6 == 0;
        uVar6 = uVar6 - 1;
        iVar4 = (int)uVar7;
        if (bVar8) break;
        if (iVar2 <= iVar4) {
          bVar8 = true;
          goto LAB_00195182;
        }
        iVar3 = sqlite3Fts5GetVarint32((uchar *)(uVar7 + (long)pvVar5),(u32 *)aCol);
        uVar7 = (ulong)(uint)(iVar4 + iVar3);
        aCol = (int *)((u32 *)aCol + 1);
      }
      bVar8 = iVar4 != iVar2;
    }
LAB_00195182:
    iVar4 = sqlite3_reset(pStmt);
    iVar2 = 0x10b;
    if (iVar4 != 0) {
      iVar2 = iVar4;
    }
    if (!bVar8) {
      iVar2 = iVar4;
    }
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5StorageDocsize(Fts5Storage *p, i64 iRowid, int *aCol){
  int nCol = p->pConfig->nCol;    /* Number of user columns in table */
  sqlite3_stmt *pLookup = 0;      /* Statement to query %_docsize */
  int rc;                         /* Return Code */

  assert( p->pConfig->bColumnsize );
  rc = fts5StorageGetStmt(p, FTS5_STMT_LOOKUP_DOCSIZE, &pLookup, 0);
  if( rc==SQLITE_OK ){
    int bCorrupt = 1;
    sqlite3_bind_int64(pLookup, 1, iRowid);
    if( SQLITE_ROW==sqlite3_step(pLookup) ){
      const u8 *aBlob = sqlite3_column_blob(pLookup, 0);
      int nBlob = sqlite3_column_bytes(pLookup, 0);
      if( 0==fts5StorageDecodeSizeArray(aCol, nCol, aBlob, nBlob) ){
        bCorrupt = 0;
      }
    }
    rc = sqlite3_reset(pLookup);
    if( bCorrupt && rc==SQLITE_OK ){
      rc = FTS5_CORRUPT;
    }
  }

  return rc;
}